

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parsecopyright(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  rnnauthor *prVar4;
  char **ppcVar5;
  rnnauthor **pprVar6;
  char *local_68;
  char *nickname;
  xmlAttr *nickattr;
  xmlNode *authorchild;
  xmlAttr *authorattr;
  rnnauthor *author;
  xmlNode *chain;
  _xmlAttr *p_Stack_30;
  uint firstyear;
  xmlAttr *attr;
  rnncopyright *copyright;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  for (p_Stack_30 = node->properties; p_Stack_30 != (xmlAttr *)0x0; p_Stack_30 = p_Stack_30->next) {
    iVar1 = strcmp((char *)p_Stack_30->name,"year");
    if (iVar1 == 0) {
      uVar2 = getnumattrib(db,file,(uint)node->line,p_Stack_30);
      if (((db->copyright).firstyear == 0) || ((uint)uVar2 < (db->copyright).firstyear)) {
        (db->copyright).firstyear = (uint)uVar2;
      }
    }
    else {
      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",file,(ulong)node->line,
              p_Stack_30->name);
      db->estatus = 1;
    }
  }
  author = (rnnauthor *)node->children;
  do {
    if (author == (rnnauthor *)0x0) {
      return;
    }
    if (*(int *)&author->email == 1) {
      iVar1 = strcmp(author->contributions,"license");
      if (iVar1 == 0) {
        if ((db->copyright).license == (char *)0x0) {
          pcVar3 = getcontent((xmlNode *)author);
          (db->copyright).license = pcVar3;
        }
        else {
          iVar1 = strcmp((db->copyright).license,(char *)node->content);
          if (iVar1 != 0) {
            fprintf(_stderr,"fatal error: multiple different licenses specified!\n");
            abort();
          }
        }
      }
      else {
        iVar1 = strcmp(author->contributions,"author");
        if (iVar1 == 0) {
          prVar4 = (rnnauthor *)calloc(0x30,1);
          authorchild = *(xmlNode **)&author[1].nicknamesnum;
          nickattr = (xmlAttr *)author->license;
          pcVar3 = getcontent((xmlNode *)author);
          prVar4->contributions = pcVar3;
          for (; authorchild != (xmlNode *)0x0; authorchild = authorchild->next) {
            iVar1 = strcmp((char *)authorchild->name,"name");
            if (iVar1 == 0) {
              pcVar3 = getattrib(db,file,(uint)*(ushort *)&author[2].contributions,
                                 (xmlAttr *)authorchild);
              pcVar3 = strdup(pcVar3);
              prVar4->name = pcVar3;
            }
            else {
              iVar1 = strcmp((char *)authorchild->name,"email");
              if (iVar1 == 0) {
                pcVar3 = getattrib(db,file,(uint)*(ushort *)&author[2].contributions,
                                   (xmlAttr *)authorchild);
                pcVar3 = strdup(pcVar3);
                prVar4->email = pcVar3;
              }
              else {
                fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",file,
                        (ulong)*(ushort *)&author[2].contributions,authorchild->name);
                db->estatus = 1;
              }
            }
          }
          for (; nickattr != (xmlAttr *)0x0; nickattr = nickattr->next) {
            if (nickattr->type == XML_ELEMENT_NODE) {
              iVar1 = strcmp((char *)nickattr->name,"nick");
              if (iVar1 == 0) {
                nickname = (char *)nickattr->psvi;
                local_68 = (char *)0x0;
                for (; nickname != (char *)0x0; nickname = *(char **)(nickname + 0x30)) {
                  iVar1 = strcmp(*(char **)(nickname + 0x10),"name");
                  if (iVar1 == 0) {
                    pcVar3 = getattrib(db,file,(uint)*(ushort *)&nickattr[1].name,
                                       (xmlAttr *)nickname);
                    local_68 = strdup(pcVar3);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",file,
                            (ulong)*(ushort *)&nickattr[1].name,*(undefined8 *)(nickname + 0x10));
                    db->estatus = 1;
                  }
                }
                if (local_68 == (char *)0x0) {
                  fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",file,
                          (ulong)*(ushort *)&nickattr[1].name);
                  db->estatus = 1;
                }
                else {
                  if (prVar4->nicknamesmax <= prVar4->nicknamesnum) {
                    if (prVar4->nicknamesmax == 0) {
                      prVar4->nicknamesmax = 0x10;
                    }
                    else {
                      prVar4->nicknamesmax = prVar4->nicknamesmax << 1;
                    }
                    ppcVar5 = (char **)realloc(prVar4->nicknames,(long)prVar4->nicknamesmax << 3);
                    prVar4->nicknames = ppcVar5;
                  }
                  iVar1 = prVar4->nicknamesnum;
                  prVar4->nicknamesnum = iVar1 + 1;
                  prVar4->nicknames[iVar1] = local_68;
                }
              }
              else {
                fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",file,
                        (ulong)*(ushort *)&nickattr[1].name,nickattr->name);
                db->estatus = 1;
              }
            }
          }
          if ((db->copyright).authorsmax <= (db->copyright).authorsnum) {
            if ((db->copyright).authorsmax == 0) {
              (db->copyright).authorsmax = 0x10;
            }
            else {
              (db->copyright).authorsmax = (db->copyright).authorsmax << 1;
            }
            pprVar6 = (rnnauthor **)
                      realloc((db->copyright).authors,(long)(db->copyright).authorsmax << 3);
            (db->copyright).authors = pprVar6;
          }
          iVar1 = (db->copyright).authorsnum;
          (db->copyright).authorsnum = iVar1 + 1;
          (db->copyright).authors[iVar1] = prVar4;
        }
        else {
          fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",file,
                  (ulong)*(ushort *)&author[2].contributions,author->contributions);
          db->estatus = 1;
        }
      }
    }
    author = (rnnauthor *)author[1].name;
  } while( true );
}

Assistant:

static void parsecopyright(struct rnndb *db, char *file, xmlNode *node) {
	struct rnncopyright* copyright = &db->copyright;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "year")) {
			unsigned firstyear = getnumattrib(db, file, node->line, attr);
			if(!copyright->firstyear || firstyear < copyright->firstyear)
				copyright->firstyear = firstyear;
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for copyright\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!strcmp(chain->name, "license"))
			if(copyright->license) {
				if(strcmp(copyright->license, node->content)) {
					fprintf(stderr, "fatal error: multiple different licenses specified!\n");
					abort(); /* TODO: do something better here, but headergen, xml2html, etc. should not produce anything in this case */
				}
			} else
				copyright->license = getcontent(chain);
		else if (!strcmp(chain->name, "author")) {
			struct rnnauthor* author = calloc(sizeof *author, 1);
			xmlAttr* authorattr = chain->properties;
			xmlNode *authorchild = chain->children;
			author->contributions = getcontent(chain);
			while (authorattr) {
				if (!strcmp(authorattr->name, "name"))
					author->name = strdup(getattrib(db, file, chain->line, authorattr));
				else if (!strcmp(authorattr->name, "email"))
					author->email = strdup(getattrib(db, file, chain->line, authorattr));
				else {
					fprintf (stderr, "%s:%d: wrong attribute \"%s\" for author\n", file, chain->line, authorattr->name);
					db->estatus = 1;
				}
				authorattr = authorattr->next;
			}
			while(authorchild)  {
				if (authorchild->type != XML_ELEMENT_NODE) {
				} else if (!strcmp(authorchild->name, "nick")) {
					xmlAttr* nickattr = authorchild->properties;
					char* nickname = 0;
					while(nickattr) {
						if (!strcmp(nickattr->name, "name"))
							nickname = strdup(getattrib(db, file, authorchild->line, nickattr));
						else {
							fprintf (stderr, "%s:%d: wrong attribute \"%s\" for nick\n", file, authorchild->line, nickattr->name);
							db->estatus = 1;
						}
						nickattr = nickattr->next;
					}
					if(!nickname) {
						fprintf (stderr, "%s:%d: missing \"name\" attribute for nick\n", file, authorchild->line);
						db->estatus = 1;
					} else
						ADDARRAY(author->nicknames, nickname);
				} else {
					fprintf (stderr, "%s:%d: wrong tag in author: <%s>\n", file, authorchild->line, authorchild->name);
					db->estatus = 1;
				}
				authorchild = authorchild->next;
			}
			ADDARRAY(copyright->authors, author);
		} else {
			fprintf (stderr, "%s:%d: wrong tag in copyright: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}